

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O3

void __thiscall Metrics::Report(Metrics *this)

{
  undefined8 *puVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  
  plVar3 = *(long **)this;
  if (plVar3 == *(long **)&this->field_0x8) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar2 = *(uint *)(*plVar3 + 8);
      if ((int)*(uint *)(*plVar3 + 8) < (int)uVar4) {
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
      plVar3 = plVar3 + 1;
    } while (plVar3 != *(long **)&this->field_0x8);
  }
  printf("%-*s\t%-6s\t%-9s\t%s\n",(ulong)uVar4,"metric","count","avg (us)","total (ms)");
  plVar3 = *(long **)this;
  if (plVar3 != *(long **)&this->field_0x8) {
    do {
      puVar1 = (undefined8 *)*plVar3;
      printf("%-*s\t%-6d\t%-8.1f\t%.1f\n",(double)(long)puVar1[5] / (double)*(int *)(puVar1 + 4),
             (double)(long)puVar1[5] / 1000.0,(ulong)uVar4,*puVar1);
      plVar3 = plVar3 + 1;
    } while (plVar3 != *(long **)&this->field_0x8);
  }
  return;
}

Assistant:

void Metrics::Report() {
  int width = 0;
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    width = max((int)(*i)->name.size(), width);
  }

  printf("%-*s\t%-6s\t%-9s\t%s\n", width,
         "metric", "count", "avg (us)", "total (ms)");
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    Metric* metric = *i;
    double total = metric->sum / (double)1000;
    double avg = metric->sum / (double)metric->count;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n", width, metric->name.c_str(),
           metric->count, avg, total);
  }
}